

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvagetpmu.c
# Opt level: O2

int g80_physpages_from_pt(uint64_t pt,int hostmem,uint64_t *phys_pages)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  
  uVar4 = (uint)(pt >> 0x10) & 0xffffff;
  uVar1 = uVar4 + 0x2000000;
  if (hostmem == 0) {
    uVar1 = uVar4;
  }
  *(uint *)((long)(*nva_cards)->bar0 + 0x1700) = uVar1;
  iVar3 = 0;
  for (iVar5 = 0; iVar5 != 0x2000; iVar5 = iVar5 + 8) {
    uVar1 = peek(((uint)pt & 0xffff | 0x700000) + iVar5);
    if (0xfff < uVar1 && (char)uVar1 == '1') {
      lVar2 = (long)iVar3;
      iVar3 = iVar3 + 1;
      phys_pages[lVar2] = (ulong)(uVar1 & 0xfffff000);
    }
  }
  return iVar3;
}

Assistant:

int g80_physpages_from_pt(uint64_t pt, int hostmem, uint64_t *phys_pages)
{
	uint32_t lo, hi;
	int i;
	uint32_t tmp;
	int entries = 0;

	hi = (pt & 0xffffff0000ull) >> 16;
	if (hostmem)
		hi |= 0x2000000;

	lo = (pt & 0xffff);

	// Lets go and read this pt
	poke(0x1700, hi);
	for (i = 0; i < 1024; i++, lo += 8) {
		tmp = peek(0x700000 + lo);
		if ((tmp & 0x000000ff) != 0x31) {
			continue;
		}
		if (tmp & 0xfffff000)
			phys_pages[entries++] = tmp & 0xfffff000ull;

	}

	return entries;
}